

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_event.hpp
# Opt level: O3

type_conflict1 __thiscall
jsoncons::basic_staj_event<char>::get_<unsigned_int,std::allocator<char>>
          (basic_staj_event<char> *this,undefined8 param_2,error_code *param_3)

{
  uint uVar1;
  type tVar2;
  uint val;
  type_conflict1 local_c;
  
  switch(this->event_type_) {
  case string_value:
    tVar2 = detail::to_integer<unsigned_int,char>
                      ((this->value_).string_data_,this->length_,&local_c);
    if (tVar2.ec == success) {
      return local_c;
    }
  default:
    std::error_code::operator=(param_3,not_integer);
    uVar1 = 0;
    break;
  case bool_value:
    uVar1 = (uint)(this->value_).bool_value_;
    break;
  case int64_value:
  case uint64_value:
    uVar1 = *(uint *)&this->value_;
    break;
  case half_value:
    uVar1 = (uint)(this->value_).half_value_;
    break;
  case double_value:
    uVar1 = (uint)(long)(this->value_).double_value_;
  }
  return uVar1;
}

Assistant:

typename std::enable_if<ext_traits::is_integer<IntegerType>::value, IntegerType>::type
    get_(Allocator, std::error_code& ec) const
    {
        switch (event_type_)
        {
            case staj_event_type::string_value:
            {
                IntegerType val;
                auto result = jsoncons::detail::to_integer(value_.string_data_, length_, val);
                if (!result)
                {
                    ec = conv_errc::not_integer;
                    return IntegerType();
                }
                return val;
            }
            case staj_event_type::half_value:
                return static_cast<IntegerType>(value_.half_value_);
            case staj_event_type::double_value:
                return static_cast<IntegerType>(value_.double_value_);
            case staj_event_type::int64_value:
                return static_cast<IntegerType>(value_.int64_value_);
            case staj_event_type::uint64_value:
                return static_cast<IntegerType>(value_.uint64_value_);
            case staj_event_type::bool_value:
                return static_cast<IntegerType>(value_.bool_value_ ? 1 : 0);
            default:
                ec = conv_errc::not_integer;
                return IntegerType();
        }
    }